

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transport.cpp
# Opt level: O0

void __thiscall adios2::Transport::InitProfiler(Transport *this,Mode openMode,TimeUnit timeUnit)

{
  char (*__args) [6];
  int in_ESI;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_false,_true>,_bool>
  pVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar2;
  Timer *in_stack_fffffffffffff940;
  pair<const_char_*,_adios2::profiling::Timer> *in_stack_fffffffffffff948;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_fffffffffffff950;
  allocator *this_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
  in_stack_fffffffffffff960;
  string *in_stack_fffffffffffff968;
  Timer *in_stack_fffffffffffff970;
  allocator local_5e9;
  string local_5e8 [184];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_530;
  undefined1 local_528;
  undefined4 local_51c;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
  local_518;
  undefined1 local_510;
  undefined1 local_501 [185];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_448;
  undefined1 local_440;
  undefined4 local_434;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
  local_430;
  undefined1 local_428;
  allocator local_419;
  string local_418 [184];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_360;
  undefined1 local_358;
  undefined4 local_34c;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
  local_348;
  undefined1 local_340;
  allocator local_331;
  string local_330 [184];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_278;
  undefined1 local_270;
  undefined4 local_264;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
  local_260;
  undefined1 local_258;
  allocator local_249;
  string local_248 [184];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
  local_190;
  undefined1 local_188;
  allocator local_169;
  string local_168 [348];
  int local_c;
  
  *(undefined1 *)(in_RDI + 0xe8) = 1;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"open",&local_169);
  profiling::Timer::Timer
            (in_stack_fffffffffffff970,in_stack_fffffffffffff968,
             (TimeUnit)((ulong)in_stack_fffffffffffff960._M_cur >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff960._M_cur >> 0x18,0));
  std::make_pair<char_const(&)[5],adios2::profiling::Timer>
            ((char (*) [5])in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  pVar1 = std::
          unordered_map<std::__cxx11::string,adios2::profiling::Timer,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>>
          ::emplace<std::pair<char_const*,adios2::profiling::Timer>>
                    ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>_>
                      *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  local_190._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
       ._M_cur;
  local_188 = pVar1.second;
  std::pair<const_char_*,_adios2::profiling::Timer>::~pair
            ((pair<const_char_*,_adios2::profiling::Timer> *)0xd4c950);
  profiling::Timer::~Timer(in_stack_fffffffffffff940);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  if (local_c == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"write",&local_249);
    profiling::Timer::Timer
              (in_stack_fffffffffffff970,in_stack_fffffffffffff968,
               (TimeUnit)((ulong)in_stack_fffffffffffff960._M_cur >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff960._M_cur >> 0x18,0));
    pVar1 = std::
            unordered_map<std::__cxx11::string,adios2::profiling::Timer,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>>
            ::emplace<char_const(&)[6],adios2::profiling::Timer>
                      ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>_>
                        *)in_stack_fffffffffffff950,(char (*) [6])in_stack_fffffffffffff948,
                       in_stack_fffffffffffff940);
    local_260._M_cur =
         (__node_type *)
         pVar1.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
         ._M_cur;
    local_258 = pVar1.second;
    profiling::Timer::~Timer(in_stack_fffffffffffff940);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    local_264 = 0;
    pVar2 = std::
            unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
            ::emplace<char_const(&)[6],int>
                      (in_stack_fffffffffffff950,(char (*) [6])in_stack_fffffffffffff948,
                       (int *)in_stack_fffffffffffff940);
    local_278._M_cur =
         (__node_type *)
         pVar2.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
         ._M_cur;
    local_270 = pVar2.second;
  }
  else if (local_c == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"write",&local_331);
    profiling::Timer::Timer
              (in_stack_fffffffffffff970,in_stack_fffffffffffff968,
               (TimeUnit)((ulong)in_stack_fffffffffffff960._M_cur >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff960._M_cur >> 0x18,0));
    pVar1 = std::
            unordered_map<std::__cxx11::string,adios2::profiling::Timer,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>>
            ::emplace<char_const(&)[6],adios2::profiling::Timer>
                      ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>_>
                        *)in_stack_fffffffffffff950,(char (*) [6])in_stack_fffffffffffff948,
                       in_stack_fffffffffffff940);
    local_348._M_cur =
         (__node_type *)
         pVar1.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
         ._M_cur;
    local_340 = pVar1.second;
    profiling::Timer::~Timer(in_stack_fffffffffffff940);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    local_34c = 0;
    pVar2 = std::
            unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
            ::emplace<char_const(&)[6],int>
                      (in_stack_fffffffffffff950,(char (*) [6])in_stack_fffffffffffff948,
                       (int *)in_stack_fffffffffffff940);
    local_360._M_cur =
         (__node_type *)
         pVar2.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
         ._M_cur;
    local_358 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_418,"read",&local_419);
    profiling::Timer::Timer
              (in_stack_fffffffffffff970,in_stack_fffffffffffff968,
               (TimeUnit)((ulong)in_stack_fffffffffffff960._M_cur >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff960._M_cur >> 0x18,0));
    pVar1 = std::
            unordered_map<std::__cxx11::string,adios2::profiling::Timer,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>>
            ::emplace<char_const(&)[5],adios2::profiling::Timer>
                      ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>_>
                        *)in_stack_fffffffffffff950,(char (*) [5])in_stack_fffffffffffff948,
                       in_stack_fffffffffffff940);
    local_430._M_cur =
         (__node_type *)
         pVar1.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
         ._M_cur;
    local_428 = pVar1.second;
    profiling::Timer::~Timer(in_stack_fffffffffffff940);
    std::__cxx11::string::~string(local_418);
    std::allocator<char>::~allocator((allocator<char> *)&local_419);
    local_434 = 0;
    pVar2 = std::
            unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
            ::emplace<char_const(&)[5],int>
                      (in_stack_fffffffffffff950,(char (*) [5])in_stack_fffffffffffff948,
                       (int *)in_stack_fffffffffffff940);
    local_448._M_cur =
         (__node_type *)
         pVar2.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
         ._M_cur;
    local_440 = pVar2.second;
  }
  else if (local_c == 2) {
    in_stack_fffffffffffff968 = (string *)(in_RDI + 0x78);
    in_stack_fffffffffffff970 = (Timer *)local_501;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_501 + 1),"read",(allocator *)in_stack_fffffffffffff970);
    profiling::Timer::Timer
              (in_stack_fffffffffffff970,in_stack_fffffffffffff968,
               (TimeUnit)((ulong)in_stack_fffffffffffff960._M_cur >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff960._M_cur >> 0x18,0));
    pVar1 = std::
            unordered_map<std::__cxx11::string,adios2::profiling::Timer,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>>
            ::emplace<char_const(&)[5],adios2::profiling::Timer>
                      ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>_>
                        *)in_stack_fffffffffffff950,(char (*) [5])in_stack_fffffffffffff948,
                       in_stack_fffffffffffff940);
    in_stack_fffffffffffff960._M_cur =
         (__node_type *)
         pVar1.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
         ._M_cur;
    local_510 = pVar1.second;
    local_518._M_cur = in_stack_fffffffffffff960._M_cur;
    profiling::Timer::~Timer(in_stack_fffffffffffff940);
    std::__cxx11::string::~string((string *)(local_501 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_501);
    local_51c = 0;
    pVar2 = std::
            unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
            ::emplace<char_const(&)[5],int>
                      (in_stack_fffffffffffff950,(char (*) [5])in_stack_fffffffffffff948,
                       (int *)in_stack_fffffffffffff940);
    local_530._M_cur =
         (__node_type *)
         pVar2.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
         ._M_cur;
    local_528 = pVar2.second;
  }
  __args = (char (*) [6])(in_RDI + 0x78);
  this_00 = &local_5e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e8,"close",this_00);
  profiling::Timer::Timer
            (in_stack_fffffffffffff970,in_stack_fffffffffffff968,
             (TimeUnit)((ulong)in_stack_fffffffffffff960._M_cur >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff960._M_cur >> 0x18,0));
  pVar1 = std::
          unordered_map<std::__cxx11::string,adios2::profiling::Timer,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>>
          ::emplace<char_const(&)[6],adios2::profiling::Timer>
                    ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>_>
                      *)this_00,__args,in_stack_fffffffffffff940);
  profiling::Timer::~Timer
            ((Timer *)pVar1.first.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
                      ._M_cur.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
            );
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  return;
}

Assistant:

void Transport::InitProfiler(const Mode openMode, const TimeUnit timeUnit)
{
    m_Profiler.m_IsActive = true;

    m_Profiler.m_Timers.emplace(
        std::make_pair("open", profiling::Timer("open", TimeUnit::Microseconds)));

    if (openMode == Mode::Write)
    {
        m_Profiler.m_Timers.emplace("write", profiling::Timer("write", timeUnit));

        m_Profiler.m_Bytes.emplace("write", 0);
    }
    else if (openMode == Mode::Append)
    {
        /*
        m_Profiler.Timers.emplace(
            "append", profiling::Timer("append", timeUnit));
        m_Profiler.Bytes.emplace("append", 0);
        */
        m_Profiler.m_Timers.emplace("write", profiling::Timer("write", timeUnit));

        m_Profiler.m_Bytes.emplace("write", 0);

        m_Profiler.m_Timers.emplace("read", profiling::Timer("read", timeUnit));

        m_Profiler.m_Bytes.emplace("read", 0);
    }
    else if (openMode == Mode::Read)
    {
        m_Profiler.m_Timers.emplace("read", profiling::Timer("read", timeUnit));
        m_Profiler.m_Bytes.emplace("read", 0);
    }

    m_Profiler.m_Timers.emplace("close", profiling::Timer("close", TimeUnit::Microseconds));
}